

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void setarrayvector(lua_State *L,Table *t,int size)

{
  int iVar1;
  TValue *pTVar2;
  int *piVar3;
  long lVar4;
  
  if (-2 < size) {
    pTVar2 = (TValue *)luaM_realloc_(L,t->array,(long)t->sizearray << 4,(long)size << 4);
    t->array = pTVar2;
    iVar1 = t->sizearray;
    if (iVar1 < size) {
      lVar4 = (long)size - (long)iVar1;
      piVar3 = &pTVar2[iVar1].tt;
      do {
        *piVar3 = 0;
        piVar3 = piVar3 + 4;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    t->sizearray = size;
    return;
  }
  luaG_runerror(L,"memory allocation error: block too big");
}

Assistant:

static void setarrayvector(lua_State*L,Table*t,int size){
int i;
luaM_reallocvector(L,t->array,t->sizearray,size,TValue);
for(i=t->sizearray;i<size;i++)
setnilvalue(&t->array[i]);
t->sizearray=size;
}